

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::TraceBuffer::SequenceIterator::MoveNext(SequenceIterator *this)

{
  ChunkID CVar1;
  bool bVar2;
  pointer ppVar3;
  _Self *__x;
  ChunkID last_chunk_id;
  SequenceIterator *this_local;
  
  bVar2 = std::operator==(&this->cur,&this->seq_end);
  if ((bVar2) ||
     (ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>
               ::operator->(&this->cur), (ppVar3->first).chunk_id == this->wrapping_id)) {
    (this->cur)._M_node = (this->seq_end)._M_node;
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>
             ::operator->(&this->cur);
    bVar2 = ChunkMeta::is_complete(&ppVar3->second);
    if (bVar2) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>
               ::operator->(&this->cur);
      CVar1 = (ppVar3->first).chunk_id;
      __x = std::
            _Rb_tree_iterator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>
            ::operator++(&this->cur);
      bVar2 = std::operator==(__x,&this->seq_end);
      if (bVar2) {
        (this->cur)._M_node = (this->seq_begin)._M_node;
      }
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_perfetto::TraceBuffer::ChunkMeta::Key,_perfetto::TraceBuffer::ChunkMeta>_>
               ::operator->(&this->cur);
      if (CVar1 + 1 != (ppVar3->first).chunk_id) {
        (this->cur)._M_node = (this->seq_end)._M_node;
      }
    }
    else {
      (this->cur)._M_node = (this->seq_end)._M_node;
    }
  }
  return;
}

Assistant:

void TraceBuffer::SequenceIterator::MoveNext() {
  // Stop iterating when we reach the end of the sequence.
  // Note: |seq_begin| might be == |seq_end|.
  if (cur == seq_end || cur->first.chunk_id == wrapping_id) {
    cur = seq_end;
    return;
  }

  // If the current chunk wasn't completed yet, we shouldn't advance past it as
  // it may be rewritten with additional packets.
  if (!cur->second.is_complete()) {
    cur = seq_end;
    return;
  }

  ChunkID last_chunk_id = cur->first.chunk_id;
  if (++cur == seq_end)
    cur = seq_begin;

  // There may be a missing chunk in the sequence of chunks, in which case the
  // next chunk's ID won't follow the last one's. If so, skip the rest of the
  // sequence. We'll return to it later once the hole is filled.
  if (last_chunk_id + 1 != cur->first.chunk_id)
    cur = seq_end;
}